

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::JsonCodec::AnnotatedHandler> * __thiscall
kj::Own<capnp::JsonCodec::AnnotatedHandler>::operator=
          (Own<capnp::JsonCodec::AnnotatedHandler> *this,
          Own<capnp::JsonCodec::AnnotatedHandler> *other)

{
  AnnotatedHandler *object;
  AnnotatedHandler *this_00;
  AnnotatedHandler *pAVar1;
  Disposer *in_RDX;
  
  object = (AnnotatedHandler *)this->disposer;
  this_00 = this->ptr;
  pAVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pAVar1;
  other->ptr = (AnnotatedHandler *)0x0;
  if (this_00 != (AnnotatedHandler *)0x0) {
    Disposer::Dispose_<capnp::JsonCodec::AnnotatedHandler,_true>::dispose
              ((Dispose_<capnp::JsonCodec::AnnotatedHandler,_true> *)this_00,object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }